

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O0

vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
* __thiscall
spvtools::opt::analysis::Constant::GetVectorComponents
          (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
           *__return_storage_ptr__,Constant *this,ConstantManager *const_mgr)

{
  uint uVar1;
  ConstantManager *this_00;
  int iVar2;
  uint32_t uVar3;
  undefined4 extraout_var;
  Type *pTVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  const_reference __x;
  Constant *pCVar5;
  uint local_6c;
  undefined1 local_68 [4];
  uint32_t i_1;
  Constant *local_50;
  Constant *element_null_const;
  Type *element_type;
  Vector *pVStack_38;
  uint32_t i;
  Vector *vector_type;
  VectorConstant *a;
  ConstantManager *local_20;
  ConstantManager *const_mgr_local;
  Constant *this_local;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *components;
  
  a._7_1_ = 0;
  local_20 = const_mgr;
  const_mgr_local = (ConstantManager *)this;
  this_local = (Constant *)__return_storage_ptr__;
  std::
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  ::vector(__return_storage_ptr__);
  iVar2 = (*this->_vptr_Constant[0x13])();
  vector_type = (Vector *)CONCAT44(extraout_var,iVar2);
  pTVar4 = type(this);
  iVar2 = (*pTVar4->_vptr_Type[0xe])();
  pVStack_38 = (Vector *)CONCAT44(extraout_var_00,iVar2);
  if (pVStack_38 != (Vector *)0x0) {
    if (vector_type == (Vector *)0x0) {
      pTVar4 = Vector::element_type(pVStack_38);
      this_00 = local_20;
      element_null_const = (Constant *)pTVar4;
      memset(local_68,0,0x18);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
      pCVar5 = ConstantManager::GetConstant
                         (this_00,pTVar4,
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
      local_50 = pCVar5;
      for (local_6c = 0; uVar3 = Vector::element_count(pVStack_38), local_6c < uVar3;
          local_6c = local_6c + 1) {
        std::
        vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        ::push_back(__return_storage_ptr__,&local_50);
      }
    }
    else {
      for (element_type._4_4_ = 0; uVar1 = element_type._4_4_,
          uVar3 = Vector::element_count(pVStack_38), uVar1 < uVar3;
          element_type._4_4_ = element_type._4_4_ + 1) {
        iVar2 = (*(vector_type->super_Type)._vptr_Type[0x18])();
        __x = std::
              vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
              ::operator[]((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                            *)CONCAT44(extraout_var_01,iVar2),(ulong)element_type._4_4_);
        std::
        vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        ::push_back(__return_storage_ptr__,__x);
      }
    }
    return __return_storage_ptr__;
  }
  __assert_fail("vector_type != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/constants.cpp"
                ,0x22b,
                "std::vector<const analysis::Constant *> spvtools::opt::analysis::Constant::GetVectorComponents(analysis::ConstantManager *) const"
               );
}

Assistant:

std::vector<const analysis::Constant*> Constant::GetVectorComponents(
    analysis::ConstantManager* const_mgr) const {
  std::vector<const analysis::Constant*> components;
  const analysis::VectorConstant* a = this->AsVectorConstant();
  const analysis::Vector* vector_type = this->type()->AsVector();
  assert(vector_type != nullptr);
  if (a != nullptr) {
    for (uint32_t i = 0; i < vector_type->element_count(); ++i) {
      components.push_back(a->GetComponents()[i]);
    }
  } else {
    const analysis::Type* element_type = vector_type->element_type();
    const analysis::Constant* element_null_const =
        const_mgr->GetConstant(element_type, {});
    for (uint32_t i = 0; i < vector_type->element_count(); ++i) {
      components.push_back(element_null_const);
    }
  }
  return components;
}